

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O1

void throughput_tcp_main(void)

{
  iovec *__iovec;
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  epoll_event *peVar6;
  request *prVar7;
  ssize_t sVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  tcp_connection *conn;
  size_t *psVar14;
  long lVar15;
  int *piVar16;
  long in_FS_OFFSET;
  byte_req_pair bVar17;
  timespec ts;
  timespec tx_timestamp;
  int local_84;
  timespec local_80;
  int local_6c;
  epoll_event *local_68;
  long local_60;
  size_t *local_58;
  iovec *local_50;
  ulong local_48;
  timespec local_40;
  
  iVar3 = throughput_open_connections();
  if (iVar3 != 0) {
    return;
  }
  iVar3 = get_conn_count();
  local_6c = get_thread_count();
  local_6c = iVar3 / local_6c;
  peVar6 = (epoll_event *)malloc((long)local_6c * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  iVar3 = clock_gettime(1,&local_80);
  if (iVar3 == 0) {
    lVar13 = (long)((double)local_80.tv_sec * 1000000000.0 + (double)local_80.tv_nsec);
    local_68 = peVar6;
    do {
      while( true ) {
        iVar3 = should_load();
        if (iVar3 == 0) break;
        while( true ) {
          iVar3 = clock_gettime(1,&local_80);
          if (iVar3 != 0) goto LAB_001095d1;
          if ((long)((double)local_80.tv_sec * 1000000000.0 + (double)local_80.tv_nsec) < lVar13)
          break;
          uVar5 = *(uint *)(in_FS_OFFSET + -0x1e0);
          *(uint *)(in_FS_OFFSET + -0x1e0) = uVar5 + 1;
          iVar3 = get_conn_count();
          iVar4 = get_thread_count();
          lVar15 = *(long *)(in_FS_OFFSET + -0x1f0);
          lVar11 = (long)(int)((ulong)uVar5 % ((long)iVar3 / (long)iVar4 & 0xffffffffU)) * 0x400c;
          uVar1 = *(ushort *)(lVar15 + 8 + lVar11);
          iVar3 = get_max_pending_reqs();
          if ((iVar3 <= (int)(uint)uVar1) ||
             (piVar16 = (int *)(lVar15 + lVar11), *(short *)((long)piVar16 + 6) != 0)) {
            piVar16 = (int *)0x0;
          }
          if (piVar16 == (int *)0x0) break;
          local_60 = lVar13;
          prVar7 = prepare_request();
          local_48 = 0;
          local_84 = 0;
          if (0 < (long)prVar7->iov_cnt) {
            lVar13 = 0;
            local_84 = 0;
            do {
              local_84 = local_84 + *(int *)((long)&prVar7->iovs[0].iov_len + lVar13);
              lVar13 = lVar13 + 0x10;
            } while ((long)prVar7->iov_cnt * 0x10 != lVar13);
          }
          local_50 = prVar7->iovs;
          local_58 = &prVar7->iovs[0].iov_len;
          while( true ) {
            uVar12 = (ulong)(int)local_48;
            __iovec = (iovec *)(local_50 + uVar12);
            while( true ) {
              sVar8 = writev(*piVar16,__iovec,prVar7->iov_cnt);
              uVar5 = (uint)sVar8;
              if (-1 < (int)uVar5) break;
              piVar9 = __errno_location();
              if (*piVar9 != 0xb) {
                throughput_tcp_main_cold_1();
                return;
              }
            }
            local_84 = local_84 - uVar5;
            if (local_84 == 0) break;
            iVar3 = prVar7->iov_cnt;
            iVar4 = (int)local_48;
            uVar2 = local_48;
            if (0 < iVar3) {
              psVar14 = local_58 + uVar12 * 2;
              do {
                uVar10 = (ulong)(int)sVar8;
                uVar2 = *psVar14;
                sVar8 = uVar10 - uVar2;
                if (uVar10 < uVar2) {
                  *psVar14 = uVar2 - uVar10;
                  ((iovec *)(psVar14 + -1))->iov_base =
                       (void *)((long)((iovec *)(psVar14 + -1))->iov_base + uVar10);
                  uVar2 = uVar12;
                  break;
                }
                uVar12 = uVar12 + 1;
                psVar14 = psVar14 + 2;
                uVar2 = uVar12;
              } while ((long)uVar12 < (long)(iVar3 + iVar4));
            }
            local_48 = uVar2 & 0xffffffff;
            prVar7->iov_cnt = (iVar4 - (int)uVar2) + iVar3;
          }
          *(short *)(piVar16 + 2) = (short)piVar16[2] + 1;
          iVar3 = clock_gettime(1,&local_40);
          if (iVar3 != 0) {
            __assert_fail("r == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                          ,0x2f,"void time_ns_to_ts(struct timespec *)");
          }
          add_tx_timestamp((timespec *)&local_40);
          bVar17.reqs = 1;
          bVar17.bytes = (ulong)(uVar5 & 0x7fffffff);
          add_throughput_tx_sample(bVar17);
          lVar13 = get_ia();
          lVar13 = local_60 + lVar13;
        }
        peVar6 = local_68;
        uVar5 = epoll_wait(*(int *)(in_FS_OFFSET + -0x1f8),local_68,local_6c,0);
        if (0 < (int)uVar5) {
          lVar15 = 0;
          do {
            if ((*(byte *)((long)&peVar6->events + lVar15) & 1) == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                            ,0x150,"void throughput_tcp_main(void)");
            }
            conn = (tcp_connection *)
                   ((long)*(int *)(&peVar6->field_0x4 + lVar15) * 0x400c +
                   *(long *)(in_FS_OFFSET + -0x1f0));
            sVar8 = recv(conn->fd,conn->buffer + conn->buffer_idx,0x4000 - (ulong)conn->buffer_idx,0
                        );
            if (((int)sVar8 < 0) && (piVar16 = __errno_location(), *piVar16 != 0xb)) {
              throughput_tcp_main_cold_2();
              return;
            }
            if ((int)sVar8 == 0) {
              throughput_tcp_main_cold_3();
            }
            else {
              conn->buffer_idx = conn->buffer_idx + (short)sVar8;
              bVar17 = handle_response(conn);
              if (bVar17.reqs != 0) {
                conn->pending_reqs = conn->pending_reqs - (short)bVar17.reqs;
                add_throughput_rx_sample(bVar17);
              }
            }
            lVar15 = lVar15 + 0xc;
          } while ((ulong)uVar5 * 0xc != lVar15);
        }
      }
      iVar3 = clock_gettime(1,&local_80);
      if (iVar3 != 0) break;
      lVar13 = (long)((double)local_80.tv_sec * 1000000000.0 + (double)local_80.tv_nsec);
    } while( true );
  }
LAB_001095d1:
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                ,0x28,"int64_t time_ns()");
}

Assistant:

static void throughput_tcp_main(void)
{
	int ready, idx, i, conn_per_thread, ret, bytes_to_send;
	long next_tx;
	struct epoll_event *events;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timespec tx_timestamp;
	int start_iov;

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		while (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;
			to_send = prepare_request();
			bytes_to_send = 0;
			start_iov = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;
			while (1) {
				ret = writev(conn->fd, &to_send->iovs[start_iov], to_send->iov_cnt);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error write\n");
					return;
				}
				if (ret < 0)
					continue;
				if (ret == bytes_to_send)
					break;
				bytes_to_send -= ret;
				for (i = start_iov; i < start_iov + to_send->iov_cnt; i++) {
					if (ret < to_send->iovs[i].iov_len) {
						to_send->iovs[i].iov_len -= ret;
						to_send->iovs[i].iov_base += ret;
						break;
					}
					ret -= to_send->iovs[i].iov_len;
				}
				to_send->iov_cnt -= i - start_iov;
				start_iov = i;
			}
			conn->pending_reqs++;
			time_ns_to_ts(&tx_timestamp);
			add_tx_timestamp(&tx_timestamp);

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}
	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			if (events[i].events & EPOLLIN) {
				// read into the connection buffer
				ret = recv(conn->fd, &conn->buffer[conn->buffer_idx],
						   MAX_PAYLOAD - conn->buffer_idx, 0);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error read\n");
					return;
				}
				if (ret == 0) {
					close(conn->fd);
					lancet_fprintf(stderr, "Connection closed\n");
					conn->closed = 1;
					continue;
				}
				conn->buffer_idx += ret;

				read_res = handle_response(conn);
				if (read_res.reqs > 0) {
					conn->pending_reqs -= read_res.reqs;
					/* Bookkeeping */
					add_throughput_rx_sample(read_res);
				}
			} else
				assert(0);
		}
	}
}